

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void MIR_gen_init(MIR_context_t ctx)

{
  int iVar1;
  gen_ctx_t *ppgVar2;
  gen_ctx_t gen_ctx_00;
  bitmap_t pVVar3;
  void *pvVar4;
  MIR_reg_t local_2c;
  MIR_type_t local_28;
  int i_1;
  MIR_type_t type;
  int i;
  gen_ctx_t *gen_ctx_ptr;
  gen_ctx_t gen_ctx;
  MIR_context_t ctx_local;
  
  ppgVar2 = gen_ctx_loc(ctx);
  gen_ctx_00 = (gen_ctx_t)gen_malloc((gen_ctx_t)0x0,0x200);
  *ppgVar2 = gen_ctx_00;
  gen_ctx_00->ctx = ctx;
  gen_ctx_00->optimize_level = 2;
  gen_ctx_00->target_ctx = (target_ctx *)0x0;
  gen_ctx_00->data_flow_ctx = (data_flow_ctx *)0x0;
  gen_ctx_00->gvn_ctx = (gvn_ctx *)0x0;
  gen_ctx_00->lr_ctx = (lr_ctx *)0x0;
  gen_ctx_00->ra_ctx = (ra_ctx *)0x0;
  gen_ctx_00->combine_ctx = (combine_ctx *)0x0;
  gen_ctx_00->debug_file = (FILE *)0x0;
  gen_ctx_00->debug_level = 100;
  VARR_void_ptr_tcreate(&gen_ctx_00->to_free,0);
  gen_ctx_00->addr_insn_p = 0;
  VARR_MIR_op_tcreate(&gen_ctx_00->temp_ops,0x10);
  VARR_MIR_insn_tcreate(&gen_ctx_00->temp_insns,0x10);
  VARR_MIR_insn_tcreate(&gen_ctx_00->temp_insns2,0x10);
  VARR_bb_insn_tcreate(&gen_ctx_00->temp_bb_insns,0x10);
  VARR_bb_insn_tcreate(&gen_ctx_00->temp_bb_insns2,0x10);
  VARR_loop_node_tcreate(&gen_ctx_00->loop_nodes,0x20);
  VARR_loop_node_tcreate(&gen_ctx_00->queue_nodes,0x20);
  VARR_loop_node_tcreate(&gen_ctx_00->loop_entries,0x10);
  VARR_mem_attr_tcreate(&gen_ctx_00->mem_attrs,0x20);
  VARR_target_bb_version_tcreate(&gen_ctx_00->target_succ_bb_versions,0x10);
  VARR_void_ptr_tcreate(&gen_ctx_00->succ_bb_addrs,0x10);
  VARR_spot_attr_tcreate(&gen_ctx_00->spot_attrs,0x20);
  VARR_spot_attr_tcreate(&gen_ctx_00->spot2attr,0x20);
  pVVar3 = bitmap_create2(0x100);
  gen_ctx_00->temp_bitmap = pVVar3;
  pVVar3 = bitmap_create2(0x100);
  gen_ctx_00->temp_bitmap2 = pVVar3;
  pVVar3 = bitmap_create2(0x100);
  gen_ctx_00->temp_bitmap3 = pVVar3;
  init_dead_vars(gen_ctx_00);
  init_data_flow(gen_ctx_00);
  init_ssa(gen_ctx_00);
  init_gvn(gen_ctx_00);
  init_live_ranges(gen_ctx_00);
  init_coalesce(gen_ctx_00);
  init_ra(gen_ctx_00);
  init_combine(gen_ctx_00);
  target_init(gen_ctx_00);
  gen_ctx_00->max_fp_hard_regs = 0;
  gen_ctx_00->max_int_hard_regs = 0;
  for (i_1 = 0; i_1 < 0x22; i_1 = i_1 + 1) {
    iVar1 = target_fixed_hard_reg_p(i_1);
    if (iVar1 == 0) {
      iVar1 = target_hard_reg_type_ok_p(i_1,MIR_T_I32);
      if (iVar1 == 0) {
        gen_ctx_00->max_fp_hard_regs = gen_ctx_00->max_fp_hard_regs + 1;
      }
      else {
        gen_ctx_00->max_int_hard_regs = gen_ctx_00->max_int_hard_regs + 1;
      }
    }
  }
  for (local_28 = MIR_T_I8; local_28 < MIR_T_BOUND; local_28 = local_28 + MIR_T_U8) {
    pVVar3 = bitmap_create2(0x22);
    gen_ctx_00->call_used_hard_regs[local_28] = pVVar3;
    for (local_2c = 0; (int)local_2c < 0x22; local_2c = local_2c + 1) {
      iVar1 = target_call_used_hard_reg_p(local_2c,local_28);
      if (iVar1 != 0) {
        bitmap_set_bit_p(gen_ctx_00->call_used_hard_regs[local_28],(long)(int)local_2c);
      }
    }
  }
  pVVar3 = bitmap_create2(0x100);
  gen_ctx_00->tied_regs = pVVar3;
  pVVar3 = bitmap_create2(0x100);
  gen_ctx_00->addr_regs = pVVar3;
  pVVar3 = bitmap_create2(0x400);
  gen_ctx_00->insn_to_consider = pVVar3;
  pVVar3 = bitmap_create2(0x22);
  gen_ctx_00->func_used_hard_regs = pVVar3;
  pvVar4 = _MIR_get_bb_wrapper(ctx,gen_ctx_00,bb_version_generator);
  gen_ctx_00->bb_wrapper = pvVar4;
  gen_ctx_00->overall_gen_bbs_num = 0;
  gen_ctx_00->overall_bbs_num = 0;
  return;
}

Assistant:

void MIR_gen_init (MIR_context_t ctx) {
  gen_ctx_t gen_ctx, *gen_ctx_ptr = gen_ctx_loc (ctx);

  *gen_ctx_ptr = gen_ctx = gen_malloc (NULL, sizeof (struct gen_ctx));
  gen_ctx->ctx = ctx;
  optimize_level = 2;
  gen_ctx->target_ctx = NULL;
  gen_ctx->data_flow_ctx = NULL;
  gen_ctx->gvn_ctx = NULL;
  gen_ctx->lr_ctx = NULL;
  gen_ctx->ra_ctx = NULL;
  gen_ctx->combine_ctx = NULL;
#if !MIR_NO_GEN_DEBUG
  debug_file = NULL;
  debug_level = 100;
#endif
  VARR_CREATE (void_ptr_t, to_free, 0);
  addr_insn_p = FALSE;
  VARR_CREATE (MIR_op_t, temp_ops, 16);
  VARR_CREATE (MIR_insn_t, temp_insns, 16);
  VARR_CREATE (MIR_insn_t, temp_insns2, 16);
  VARR_CREATE (bb_insn_t, temp_bb_insns, 16);
  VARR_CREATE (bb_insn_t, temp_bb_insns2, 16);
  VARR_CREATE (loop_node_t, loop_nodes, 32);
  VARR_CREATE (loop_node_t, queue_nodes, 32);
  VARR_CREATE (loop_node_t, loop_entries, 16);
  VARR_CREATE (mem_attr_t, mem_attrs, 32);
  VARR_CREATE (target_bb_version_t, target_succ_bb_versions, 16);
  VARR_CREATE (void_ptr_t, succ_bb_addrs, 16);
  VARR_CREATE (spot_attr_t, spot_attrs, 32);
  VARR_CREATE (spot_attr_t, spot2attr, 32);
  temp_bitmap = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  temp_bitmap2 = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  temp_bitmap3 = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  init_dead_vars (gen_ctx);
  init_data_flow (gen_ctx);
  init_ssa (gen_ctx);
  init_gvn (gen_ctx);
  init_live_ranges (gen_ctx);
  init_coalesce (gen_ctx);
  init_ra (gen_ctx);
  init_combine (gen_ctx);
  target_init (gen_ctx);
  max_int_hard_regs = max_fp_hard_regs = 0;
  for (int i = 0; i <= MAX_HARD_REG; i++) {
    if (target_fixed_hard_reg_p (i)) continue;
    target_hard_reg_type_ok_p (i, MIR_T_I32) ? max_int_hard_regs++ : max_fp_hard_regs++;
  }
  for (MIR_type_t type = MIR_T_I8; type < MIR_T_BOUND; type++) {
    call_used_hard_regs[type] = bitmap_create2 (MAX_HARD_REG + 1);
    for (int i = 0; i <= MAX_HARD_REG; i++) {
      /* We need call_used_hard_regs even for fixed regs in combine. */
      if (target_call_used_hard_reg_p (i, type)) bitmap_set_bit_p (call_used_hard_regs[type], i);
    }
  }
  tied_regs = bitmap_create2 (256);
  addr_regs = bitmap_create2 (256);
  insn_to_consider = bitmap_create2 (1024);
  func_used_hard_regs = bitmap_create2 (MAX_HARD_REG + 1);
  bb_wrapper = _MIR_get_bb_wrapper (ctx, gen_ctx, bb_version_generator);
  overall_bbs_num = overall_gen_bbs_num = 0;
}